

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

bool __thiscall cfd::core::AddressFormatData::IsValid(AddressFormatData *this)

{
  char *pcVar1;
  initializer_list<const_char_*> __l;
  bool bVar2;
  byte bVar3;
  int iVar4;
  reference ppcVar5;
  pointer ppVar6;
  size_t sVar7;
  ulong uVar8;
  CfdException *anon_var_0;
  key_type local_1a8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *bech32;
  key_type local_170;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  undefined1 local_148 [8];
  ByteData p2sh;
  key_type local_128;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  undefined1 local_100 [8];
  ByteData p2pkh;
  key_type local_e0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  _Self local_b8;
  allocator local_a9;
  key_type local_a8;
  _Self local_88;
  char *local_80;
  char *key;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range2;
  allocator<const_char_*> local_49;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  char *pcStack_30;
  iterator local_28;
  size_type local_20;
  AddressFormatData *local_18;
  AddressFormatData *this_local;
  
  local_18 = this;
  if ((IsValid()::key_list == '\0') &&
     (iVar4 = __cxa_guard_acquire(&IsValid()::key_list), iVar4 != 0)) {
    local_38 = "p2sh";
    pcStack_30 = "bech32";
    local_48 = "nettype";
    pcStack_40 = "p2pkh";
    local_28 = &local_48;
    local_20 = 4;
    ::std::allocator<const_char_*>::allocator(&local_49);
    __l._M_len = local_20;
    __l._M_array = local_28;
    ::std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              (&IsValid::key_list,__l,&local_49);
    ::std::allocator<const_char_*>::~allocator(&local_49);
    __cxa_atexit(::std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector,
                 &IsValid::key_list,&__dso_handle);
    __cxa_guard_release(&IsValid()::key_list);
  }
  __end2 = ::std::vector<const_char_*,_std::allocator<const_char_*>_>::begin(&IsValid::key_list);
  key = (char *)::std::vector<const_char_*,_std::allocator<const_char_*>_>::end(&IsValid::key_list);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                *)&key);
    if (!bVar2) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_e0,"nettype",
                 (allocator *)
                 ((long)&p2pkh.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      local_c0._M_node =
           (_Base_ptr)
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&this->map_,&local_e0);
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->(&local_c0);
      bVar3 = ::std::__cxx11::string::empty();
      ::std::__cxx11::string::~string((string *)&local_e0);
      ::std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&p2pkh.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      if ((bVar3 & 1) == 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_128,"p2pkh",
                   (allocator *)
                   ((long)&p2sh.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 7));
        local_108._M_node =
             (_Base_ptr)
             ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&this->map_,&local_128);
        ppVar6 = ::std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_108);
        ByteData::ByteData((ByteData *)local_100,&ppVar6->second);
        ::std::__cxx11::string::~string((string *)&local_128);
        ::std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&p2sh.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 7));
        sVar7 = ByteData::GetDataSize((ByteData *)local_100);
        if (sVar7 == 1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_170,"p2sh",(allocator *)((long)&bech32 + 7));
          local_150._M_node =
               (_Base_ptr)
               ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(&this->map_,&local_170);
          ppVar6 = ::std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator->(&local_150);
          ByteData::ByteData((ByteData *)local_148,&ppVar6->second);
          ::std::__cxx11::string::~string((string *)&local_170);
          ::std::allocator<char>::~allocator((allocator<char> *)((long)&bech32 + 7));
          sVar7 = ByteData::GetDataSize((ByteData *)local_148);
          if (sVar7 == 1) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_1a8,"bech32",(allocator *)((long)&anon_var_0 + 7));
            local_188._M_node =
                 (_Base_ptr)
                 ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(&this->map_,&local_1a8);
            ppVar6 = ::std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator->(&local_188);
            ::std::__cxx11::string::~string((string *)&local_1a8);
            ::std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
            local_180 = &ppVar6->second;
            uVar8 = ::std::__cxx11::string::empty();
            if (((uVar8 & 1) == 0) && (uVar8 = ::std::__cxx11::string::size(), uVar8 < 0x55)) {
              p2sh.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
            }
            else {
              this_local._7_1_ = 0;
              p2sh.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
            }
          }
          else {
            this_local._7_1_ = 0;
            p2sh.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          }
          ByteData::~ByteData((ByteData *)local_148);
        }
        else {
          this_local._7_1_ = 0;
          p2sh.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
        ByteData::~ByteData((ByteData *)local_100);
        if ((int)p2sh.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
          this_local._7_1_ = 1;
        }
      }
      else {
        this_local._7_1_ = 0;
      }
LAB_005b9100:
      return (bool)(this_local._7_1_ & 1);
    }
    ppcVar5 = __gnu_cxx::
              __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              ::operator*(&__end2);
    pcVar1 = *ppcVar5;
    local_80 = pcVar1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_a8,pcVar1,&local_a9);
    local_88._M_node =
         (_Base_ptr)
         ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->map_,&local_a8);
    local_b8._M_node =
         (_Base_ptr)
         ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->map_);
    bVar2 = ::std::operator==(&local_88,&local_b8);
    ::std::__cxx11::string::~string((string *)&local_a8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    if (bVar2) {
      this_local._7_1_ = 0;
      goto LAB_005b9100;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool AddressFormatData::IsValid() const {
  static const std::vector<const char*> key_list = {
      kNettype, kPrefixP2pkh, kPrefixP2sh, kPrefixBech32Hrp};
  for (const char* key : key_list) {
    if (map_.find(key) == map_.end()) return false;
  }
  try {
    if (map_.find(kNettype)->second.empty()) return false;

    auto p2pkh = ByteData(map_.find(kPrefixP2pkh)->second);
    if (p2pkh.GetDataSize() != 1) return false;
    auto p2sh = ByteData(map_.find(kPrefixP2sh)->second);
    if (p2sh.GetDataSize() != 1) return false;
    auto& bech32 = map_.find(kPrefixBech32Hrp)->second;
    if (bech32.empty() || (bech32.size() > 84)) return false;
  } catch (const CfdException&) {
    return false;
  }
  return true;
}